

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

int __thiscall
TPZSFMatrix<long_double>::Subst_Backward(TPZSFMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  longdouble lVar1;
  TPZBaseMatrix *pTVar2;
  int iVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  int64_t i;
  longdouble *pk;
  longdouble sum;
  int64_t j;
  int64_t k;
  longdouble *ptr_k;
  char *in_stack_00000148;
  char *in_stack_00000150;
  longdouble local_68;
  long local_58;
  longdouble *local_50;
  longdouble local_48;
  long local_30;
  long local_28;
  longdouble *local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar4 = TPZBaseMatrix::Rows(in_RSI);
  lVar5 = (**(code **)(*in_RDI + 0x60))();
  if ((iVar4 == lVar5) && ((char)in_RDI[3] != '\0')) {
    iVar3 = (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x10])();
    if (iVar3 != 0) {
      TPZMatrix<long_double>::Error(in_stack_00000150,in_stack_00000148);
    }
    lVar5 = in_RDI[4];
    lVar6 = (**(code **)(*in_RDI + 600))();
    local_20 = (longdouble *)(lVar5 + (lVar6 + -1) * 0x10);
    local_28 = (**(code **)(*in_RDI + 0x60))();
    while (local_28 = local_28 + -1, -1 < local_28) {
      local_30 = 0;
      while( true ) {
        lVar5 = local_30;
        iVar4 = TPZBaseMatrix::Cols(local_18);
        if (iVar4 <= lVar5) break;
        local_48 = (longdouble)0;
        local_50 = local_20;
        local_58 = (**(code **)(*in_RDI + 0x60))();
        lVar7 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        while (pTVar2 = local_18, lVar6 = local_28, lVar5 = local_30, local_58 = local_58 + -1,
              local_28 < local_58) {
          lVar1 = *local_50;
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_58,local_30);
          local_48 = local_48 + lVar1 * lVar7;
          local_50 = local_50 + -local_58;
          lVar7 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST5 = in_ST4;
        }
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])();
        local_68 = (lVar7 - local_48) / *local_50;
        in_ST6 = in_ST5;
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar2,lVar6,lVar5,&local_68);
        local_30 = local_30 + 1;
      }
      local_20 = local_20 + -1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
TPZSFMatrix<TVar> ::Subst_Backward( TPZFMatrix<TVar>  *B ) const
{
	if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
		return( 0 );
	
	if ( B->IsSymmetric() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Subst_Backward <the matrix result can not be simetric>" );
	
	TVar *ptr_k = &fElem[ Size()-1 ];
	for ( int64_t k = this->Dim()-1; k >= 0; k--, ptr_k-- )
		for ( int64_t j = 0; j < B->Cols(); j++ )
		{
			// Faz sum = SOMA( A[k,i] * B[i,j] ); i = N, ..., k+1.
			//
			TVar sum = 0.0;
			TVar *pk = ptr_k;
			for ( int64_t i = this->Dim()-1; i > k; i-- )
			{
				if constexpr(is_complex<TVar>::value){
					sum += std::conj(*pk) * B->GetVal( i, j );
				}else{
					sum += (*pk) * B->GetVal( i, j );
				}
				pk -= i;
			}
			
			// Faz B[k,j] = (B[k,j] - sum) / A[k,k].
			//
			B->PutVal( k, j, (B->GetVal(k, j) - sum) / *pk );
		}
	
	return( 1 );
}